

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

void __thiscall Logger::Logger(Logger *this)

{
  Tools *pTVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pTVar1 = Tools::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,(pTVar1->path->_M_dataplus)._M_p,&local_31);
  std::operator+(&this->loggerPath,&local_30,"/.stn/logs");
  std::__cxx11::string::~string((string *)&local_30);
  std::ofstream::ofstream(&this->loggerFile);
  return;
}

Assistant:

Logger() {}